

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O3

void __thiscall m6502::reset(m6502 *this)

{
  ssize_t sVar1;
  ssize_t sVar2;
  size_t in_RCX;
  
  this->a = '\0';
  this->x = '\0';
  this->y = '\0';
  this->stackPointer = 0xfd;
  this->status = ' ';
  this->addrAbs = 0xfffc;
  sVar1 = read(this,0xfffc,(void *)0x0,in_RCX);
  sVar2 = read(this,(uint)(ushort)(this->addrAbs + 1),(void *)0x0,in_RCX);
  this->pc = (ushort)sVar1 & 0xff | (ushort)(((uint)sVar2 & 0xff) << 8);
  this->addrAbs = 0;
  this->addrRel = 0;
  this->fetched = '\0';
  this->cycles = '\b';
  return;
}

Assistant:

void reset()
  {
    a = x = y = 0;
    stackPointer = 0xFDu;
    status = 0x00 | U;

    addrAbs = 0xFFFC;
    uint16_t lo = read(addrAbs);
    uint16_t hi = read(addrAbs + 1);
    pc = (hi << 8) | lo;

    addrRel = 0x0000u;
    addrAbs = 0x0000u;
    fetched = 0x00u;

    cycles = 8;
  }